

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference_values.cxx
# Opt level: O0

lda_reference * load_lda_reference_values(Kernel k,Spin p)

{
  size_type sVar1;
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> src;
  runtime_error *prVar2;
  int in_EDX;
  int in_ESI;
  lda_reference *in_RDI;
  lda_reference *ref_vals;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff58;
  lda_reference *in_stack_ffffffffffffff60;
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  
  lda_reference::lda_reference(in_stack_ffffffffffffff60);
  if (in_EDX == 1) {
    std::back_inserter<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff58);
    copy_iterable<std::vector<double,std::allocator<double>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    sVar1 = std::vector<double,_std::allocator<double>_>::size(&rho);
    in_RDI->npts = (int)sVar1;
    if (in_ESI != 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"No Reference Values for Specified Kernel");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::back_inserter<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff58);
    copy_iterable<std::vector<double,std::allocator<double>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    src = std::back_inserter<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff58);
    copy_iterable<std::vector<double,std::allocator<double>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (src.container,in_stack_ffffffffffffff78);
  }
  else {
    std::back_inserter<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff58);
    copy_iterable<std::vector<double,std::allocator<double>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    sVar1 = std::vector<double,_std::allocator<double>_>::size(&rho_polarized);
    in_RDI->npts = (int)(sVar1 >> 1);
    if (in_ESI != 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"No Reference Values for Specified Kernel");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::back_inserter<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff58);
    copy_iterable<std::vector<double,std::allocator<double>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::back_inserter<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff58);
    copy_iterable<std::vector<double,std::allocator<double>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  return in_RDI;
}

Assistant:

lda_reference load_lda_reference_values(ExchCXX::Kernel k, ExchCXX::Spin p) {

  using namespace ExchCXX; 

  lda_reference ref_vals;

  if( p == Spin::Unpolarized ) {

    copy_iterable( rho, std::back_inserter(ref_vals.rho) );
    ref_vals.npts = rho.size();

    switch(k) {
      case Kernel::SlaterExchange:
        copy_iterable( exc_xc_lda_x_ref_unp, std::back_inserter(ref_vals.exc) );
        copy_iterable( vxc_xc_lda_x_ref_unp, std::back_inserter(ref_vals.vrho) );
        break;
      default: 
        throw std::runtime_error("No Reference Values for Specified Kernel");
    }

  } else {

    copy_iterable( rho_polarized, std::back_inserter(ref_vals.rho) );
    ref_vals.npts = rho_polarized.size() / 2;

    switch(k) {
      case Kernel::SlaterExchange:
        copy_iterable( exc_xc_lda_x_ref_pol, std::back_inserter(ref_vals.exc) );
        copy_iterable( vxc_xc_lda_x_ref_pol, std::back_inserter(ref_vals.vrho) );
        break;
      default: 
        throw std::runtime_error("No Reference Values for Specified Kernel");
    }

  }

  return ref_vals;
}